

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_initDStream_usingDDict(ZSTD_DStream *dctx,ZSTD_DDict *ddict)

{
  uint uVar1;
  size_t code;
  size_t code_00;
  ZSTD_DDict *in_RDI;
  size_t err_code_1;
  size_t err_code;
  ZSTD_DCtx *in_stack_ffffffffffffffd8;
  ZSTD_format_e format;
  ZSTD_DCtx *in_stack_fffffffffffffff8;
  
  code = ZSTD_DCtx_reset(in_stack_ffffffffffffffd8,0);
  uVar1 = ERR_isError(code);
  if (uVar1 == 0) {
    code_00 = ZSTD_DCtx_refDDict(in_stack_fffffffffffffff8,in_RDI);
    format = (ZSTD_format_e)(code >> 0x20);
    uVar1 = ERR_isError(code_00);
    code = code_00;
    if (uVar1 == 0) {
      code = ZSTD_startingInputLength(format);
    }
  }
  return code;
}

Assistant:

size_t ZSTD_initDStream_usingDDict(ZSTD_DStream* dctx, const ZSTD_DDict* ddict)
{
    DEBUGLOG(4, "ZSTD_initDStream_usingDDict");
    FORWARD_IF_ERROR( ZSTD_DCtx_reset(dctx, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_DCtx_refDDict(dctx, ddict) , "");
    return ZSTD_startingInputLength(dctx->format);
}